

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::LineInterpolationTestCase::createInstance
          (LineInterpolationTestCase *this,Context *context)

{
  LineInterpolationTestInstance *this_00;
  Context *context_local;
  LineInterpolationTestCase *this_local;
  
  this_00 = (LineInterpolationTestInstance *)operator_new(0x2c0);
  LineInterpolationTestInstance::LineInterpolationTestInstance
            (this_00,context,this->m_primitiveTopology,this->m_flags,this->m_wideness,
             (this->super_BaseRenderingTestCase).m_sampleCount);
  return (TestInstance *)this_00;
}

Assistant:

virtual TestInstance*		createInstance					(Context& context) const
								{
									return new LineInterpolationTestInstance(context, m_primitiveTopology, m_flags, m_wideness, m_sampleCount);
								}